

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.cpp
# Opt level: O2

void __thiscall rtb::Concurrency::Queue<int>::subscribe(Queue<int> *this)

{
  _List_node_base *p_Var1;
  pthread_t pVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  unique_lock<std::mutex> mlock;
  key_type local_38;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->mutex_);
  if ((Queue<int> *)
      (this->queue_).super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_next == this) {
    pVar2 = pthread_self();
    local_38._M_thread = pVar2;
    pmVar3 = std::
             map<std::thread::id,_std::_List_iterator<std::optional<int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
             ::operator[](&this->subscribersNextRead_,&local_38);
    pmVar3->_M_node = (_List_node_base *)this;
    local_38._M_thread = pVar2;
    pmVar4 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&this->subscribersMissingRead_,&local_38);
    *pmVar4 = 0;
  }
  else {
    p_Var1 = (this->queue_).
             super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl.
             _M_node.super__List_node_base._M_prev;
    pVar2 = pthread_self();
    local_38._M_thread = pVar2;
    pmVar3 = std::
             map<std::thread::id,_std::_List_iterator<std::optional<int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
             ::operator[](&this->subscribersNextRead_,&local_38);
    pmVar3->_M_node = p_Var1;
    local_38._M_thread = pVar2;
    pmVar4 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&this->subscribersMissingRead_,&local_38);
    *pmVar4 = 1;
  }
  std::unique_lock<std::mutex>::unlock(&local_30);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void Queue<T>::subscribe() {
        std::unique_lock<std::mutex> mlock(mutex_);
        if (queue_.empty()) {
            subscribersNextRead_[std::this_thread::get_id()] = queue_.end();
            subscribersMissingRead_[std::this_thread::get_id()] = 0;
        } else {
            subscribersNextRead_[std::this_thread::get_id()] = (++queue_.rbegin()).base();
            subscribersMissingRead_[std::this_thread::get_id()] = 1;
        }
        mlock.unlock();
    }